

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  string *this_00;
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  Token token;
  undefined1 local_78 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &token.data;
  do {
    if (arg->_M_string_length == 0) {
      return;
    }
    token.type = Positional;
    std::__cxx11::string::string((string *)this_00,(string *)arg);
    std::__cxx11::string::assign((char *)arg);
    if (*token.data._M_dataplus._M_p == '-') {
      if ((token.data._M_string_length < 2) || (token.data._M_dataplus._M_p[1] != '-')) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
        local_78._0_4_ = ShortOpt;
        std::__cxx11::string::string((string *)(local_78 + 8),(string *)&local_50);
        Token::operator=(&token,(Token *)local_78);
        std::__cxx11::string::~string((string *)(local_78 + 8));
        std::__cxx11::string::~string((string *)&local_50);
        if (1 < token.data._M_string_length) {
          lVar1 = std::__cxx11::string::find
                            ((char)this,(ulong)(uint)(int)token.data._M_dataplus._M_p[1]);
          if (lVar1 == -1) {
            std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
            __return_storage_ptr__ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
            std::operator+(__return_storage_ptr__,"-",&local_50);
            std::__cxx11::string::operator=((string *)arg,(string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)this_00);
            std::__cxx11::string::operator=((string *)this_00,(string *)__return_storage_ptr__);
            goto LAB_0013e785;
          }
        }
      }
      else {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
        local_78._0_4_ = LongOpt;
        std::__cxx11::string::string((string *)(local_78 + 8),(string *)&local_50);
        Token::operator=(&token,(Token *)local_78);
        std::__cxx11::string::~string((string *)(local_78 + 8));
        __return_storage_ptr__ = &local_50;
LAB_0013e785:
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
    }
    if (token.type != Positional) {
      lVar1 = std::__cxx11::string::find_first_of((string *)this_00,(ulong)this);
      if (lVar1 != -1) {
        std::__cxx11::string::substr((ulong)local_78,(ulong)this_00);
        std::__cxx11::string::operator=((string *)arg,(string *)local_78);
        std::__cxx11::string::~string((string *)local_78);
        std::__cxx11::string::substr((ulong)local_78,(ulong)this_00);
        std::__cxx11::string::operator=((string *)this_00,(string *)local_78);
        std::__cxx11::string::~string((string *)local_78);
      }
    }
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
    push_back(tokens,&token);
    std::__cxx11::string::~string((string *)this_00);
  } while( true );
}

Assistant:

void parseIntoTokens( std::string arg, std::vector<Parser::Token>& tokens ) const {
            while( !arg.empty() ) {
                Parser::Token token( Parser::Token::Positional, arg );
                arg = "";
                if( token.data[0] == '-' ) {
                    if( token.data.size() > 1 && token.data[1] == '-' ) {
                        token = Parser::Token( Parser::Token::LongOpt, token.data.substr( 2 ) );
                    }
                    else {
                        token = Parser::Token( Parser::Token::ShortOpt, token.data.substr( 1 ) );
                        if( token.data.size() > 1 && separators.find( token.data[1] ) == std::string::npos ) {
                            arg = "-" + token.data.substr( 1 );
                            token.data = token.data.substr( 0, 1 );
                        }
                    }
                }
                if( token.type != Parser::Token::Positional ) {
                    std::size_t pos = token.data.find_first_of( separators );
                    if( pos != std::string::npos ) {
                        arg = token.data.substr( pos+1 );
                        token.data = token.data.substr( 0, pos );
                    }
                }
                tokens.push_back( token );
            }
        }